

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

void __thiscall rcg::Device::enableModuleEvents(Device *this)

{
  int iVar1;
  GC_ERROR GVar2;
  GenTLException *this_00;
  string local_48;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if ((this->dev != (EVENTSRC_HANDLE)0x0) && (this->event == (void *)0x0)) {
      GVar2 = (*((this->gentl).
                 super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                GCRegisterEvent)(this->dev,5,&this->event);
      if (GVar2 != 0) goto LAB_0010ea13;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
LAB_0010ea13:
  this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Device::enableModuleEvents()","");
  GenTLException::GenTLException(this_00,&local_48,&this->gentl);
  __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

void Device::enableModuleEvents()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (dev && !event)
  {
    if (gentl->GCRegisterEvent(dev, GenTL::EVENT_MODULE, &event) != GenTL::GC_ERR_SUCCESS)
    {
      throw GenTLException("Device::enableModuleEvents()", gentl);
    }
  }
}